

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void test<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>>
               (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
                *source)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  vector<int,_std::allocator<int>_> *source_00;
  vector<int,_std::allocator<int>_> *source_01;
  vector<int,_std::allocator<int>_> *source_02;
  vector<int,_std::allocator<int>_> *source_03;
  vector<int,_std::allocator<int>_> *source_04;
  int local_bb4 [2];
  anon_class_1_0_00000001 local_bac;
  anon_class_1_0_00000001_for_filter local_bab;
  anon_class_1_0_00000001 local_baa;
  anon_class_1_0_00000001_for_filter local_ba9;
  IEnumerableCore<linq::ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
  local_ba8;
  IEnumerableCore<linq::IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
  local_b18;
  IEnumerable<int> local_a88;
  IEnumerableCore<linq::ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
  local_a70;
  allocator<int> local_9e9;
  int local_9e8 [6];
  iterator local_9d0;
  size_type local_9c8;
  vector<int,_std::allocator<int>_> local_9c0;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_9a8;
  IEnumerableCore<linq::ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
  local_978;
  allocator<int> local_8d9;
  int local_8d8 [6];
  iterator local_8c0;
  size_type local_8b8;
  vector<int,_std::allocator<int>_> local_8b0;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_898;
  IEnumerableCore<linq::IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
  local_868;
  allocator<int> local_7c9;
  int local_7c8 [6];
  iterator local_7b0;
  size_type local_7a8;
  vector<int,_std::allocator<int>_> local_7a0;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_788;
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
  local_758;
  allocator<int> local_6b9;
  int local_6b8 [6];
  iterator local_6a0;
  size_type local_698;
  vector<int,_std::allocator<int>_> local_690;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_678;
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
  local_648;
  allocator<int> local_5a9;
  int local_5a8 [6];
  iterator local_590;
  size_type local_588;
  vector<int,_std::allocator<int>_> local_580;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_568;
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
  local_538;
  anon_class_1_0_00000001_for_filter local_49a;
  anon_class_1_0_00000001 local_499;
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>_>
  local_498;
  OUT local_410;
  anon_class_1_0_00000001 local_3e9;
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>_>
  local_3e8;
  OUT local_360;
  anon_class_1_0_00000001 local_339;
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>_>
  local_338;
  anon_class_1_0_00000001_for_filter local_2a9;
  IEnumerableCore<linq::WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>_>
  local_2a8;
  IEnumerableCore<linq::SkipState<linq::WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>,_int>_>
  local_270;
  anon_class_1_0_00000001_for_filter local_219;
  IEnumerableCore<linq::WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:20:35),_int>_>
  local_218;
  anon_class_1_0_00000001_for_filter local_1d9;
  IEnumerableCore<linq::SkipWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:19:39),_int>_>
  local_1d8;
  anon_class_1_0_00000001_for_filter local_199;
  IEnumerableCore<linq::TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:18:39),_int>_>
  local_198;
  anon_class_1_0_00000001_for_filter local_159;
  IEnumerableCore<linq::TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:17:39),_int>_>
  local_158;
  IEnumerableCore<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_int>_>
  local_120;
  IEnumerableCore<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_int>_>
  local_e0;
  IEnumerableCore<linq::TakeState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_int>_>
  local_a0;
  IEnumerableCore<linq::TakeState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_int>_>
  local_50;
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
  *local_10;
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
  *source_local;
  
  local_10 = source;
  iVar2 = linq::
          IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
          ::Min(source);
  assertEquals<int,int>(3,iVar2);
  iVar2 = linq::
          IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
          ::Max(source);
  assertEquals<int,int>(10,iVar2);
  sVar3 = linq::
          IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
          ::Count(source);
  assertEquals<int,unsigned_long>(8,sVar3);
  iVar2 = linq::
          IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
          ::Sum(source);
  assertEquals<int,int>(0x34,iVar2);
  linq::
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::Take(&local_50,source,3);
  iVar2 = linq::
          IEnumerableCore<linq::TakeState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_int>_>
          ::Min(&local_50);
  assertEquals<int,int>(3,iVar2);
  linq::
  IEnumerableCore<linq::TakeState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_int>_>
  ::~IEnumerableCore(&local_50);
  linq::
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::Take(&local_a0,source,3);
  iVar2 = linq::
          IEnumerableCore<linq::TakeState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_int>_>
          ::Max(&local_a0);
  assertEquals<int,int>(5,iVar2);
  linq::
  IEnumerableCore<linq::TakeState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_int>_>
  ::~IEnumerableCore(&local_a0);
  linq::
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::Skip(&local_e0,source,3);
  iVar2 = linq::
          IEnumerableCore<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_int>_>
          ::Min(&local_e0);
  assertEquals<int,int>(6,iVar2);
  linq::
  IEnumerableCore<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_int>_>
  ::~IEnumerableCore(&local_e0);
  linq::
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::Skip(&local_120,source,3);
  iVar2 = linq::
          IEnumerableCore<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_int>_>
          ::Max(&local_120);
  assertEquals<int,int>(10,iVar2);
  linq::
  IEnumerableCore<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_int>_>
  ::~IEnumerableCore(&local_120);
  linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
  TakeWhile<test<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>>(linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>)::_lambda(int)_1_>
            (&local_158,
             (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)source,
             &local_159);
  iVar2 = linq::
          IEnumerableCore<linq::TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:17:39),_int>_>
          ::Min(&local_158);
  assertEquals<int,int>(3,iVar2);
  linq::
  IEnumerableCore<linq::TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:17:39),_int>_>
  ::~IEnumerableCore(&local_158);
  linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
  TakeWhile<test<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>>(linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>)::_lambda(int)_2_>
            (&local_198,
             (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)source,
             &local_199);
  iVar2 = linq::
          IEnumerableCore<linq::TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:18:39),_int>_>
          ::Max(&local_198);
  assertEquals<int,int>(4,iVar2);
  linq::
  IEnumerableCore<linq::TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:18:39),_int>_>
  ::~IEnumerableCore(&local_198);
  linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
  SkipWhile<test<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>>(linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>)::_lambda(int)_3_>
            (&local_1d8,
             (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)source,
             &local_1d9);
  iVar2 = linq::
          IEnumerableCore<linq::SkipWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:19:39),_int>_>
          ::Min(&local_1d8);
  assertEquals<int,int>(5,iVar2);
  linq::
  IEnumerableCore<linq::SkipWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:19:39),_int>_>
  ::~IEnumerableCore(&local_1d8);
  linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
  Where<test<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>>(linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>)::_lambda(int)_4_>
            (&local_218,
             (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)source,
             &local_219);
  sVar3 = linq::
          IEnumerableCore<linq::WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:20:35),_int>_>
          ::Count(&local_218);
  assertEquals<int,unsigned_long>(4,sVar3);
  linq::
  IEnumerableCore<linq::WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:20:35),_int>_>
  ::~IEnumerableCore(&local_218);
  linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
  Where<test<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>>(linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>)::_lambda(int)_5_>
            (&local_2a8,
             (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)source,
             &local_2a9);
  linq::
  IEnumerableCore<linq::WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>_>
  ::Skip(&local_270,&local_2a8,1);
  iVar2 = linq::
          IEnumerableCore<linq::SkipState<linq::WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>,_int>_>
          ::First(&local_270);
  assertEquals<int,int>(6,iVar2);
  linq::
  IEnumerableCore<linq::SkipState<linq::WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>,_int>_>
  ::~IEnumerableCore(&local_270);
  linq::
  IEnumerableCore<linq::WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>_>
  ::~IEnumerableCore(&local_2a8);
  linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
  GroupBy<test<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>>(linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>)::_lambda(int)_6_>
            (&local_338,
             (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)source,
             &local_339);
  sVar3 = linq::
          IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>_>
          ::Count(&local_338);
  assertEquals<int,unsigned_long>(2,sVar3);
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>_>
  ::~IEnumerableCore(&local_338);
  linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
  GroupBy<test<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>>(linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>)::_lambda(int)_7_>
            (&local_3e8,
             (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)source,
             &local_3e9);
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>_>
  ::First(&local_360,&local_3e8);
  sVar3 = linq::IEnumerable<int_&>::Count(&local_360.super_IEnumerable<int_&>);
  assertEquals<int,unsigned_long>(6,sVar3);
  linq::IGrouping<bool,_int_&>::~IGrouping(&local_360);
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>_>
  ::~IEnumerableCore(&local_3e8);
  linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
  GroupBy<test<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>>(linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>)::_lambda(int)_8_>
            (&local_498,
             (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)source,
             &local_499);
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>_>
  ::Last(&local_410,&local_498);
  sVar3 = linq::IEnumerable<int_&>::Count(&local_410.super_IEnumerable<int_&>);
  assertEquals<int,unsigned_long>(2,sVar3);
  linq::IGrouping<bool,_int_&>::~IGrouping(&local_410);
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>_>
  ::~IEnumerableCore(&local_498);
  iVar2 = linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
          Single<test<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>>(linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>)::_lambda(int)_9_>
                    ((IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)
                     source,&local_49a);
  assertEquals<int,int>(5,iVar2);
  local_5a8[0] = 1;
  local_5a8[1] = 5;
  local_5a8[2] = 6;
  local_5a8[3] = 7;
  local_5a8[4] = 5;
  local_590 = local_5a8;
  local_588 = 5;
  std::allocator<int>::allocator(&local_5a9);
  __l_03._M_len = local_588;
  __l_03._M_array = local_590;
  std::vector<int,_std::allocator<int>_>::vector(&local_580,__l_03,&local_5a9);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_568,(linq *)&local_580,source_00);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>&>
            (&local_538,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             &local_568,source);
  iVar2 = linq::
          IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Min(&local_538);
  assertEquals<int,int>(5,iVar2);
  linq::
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::~IEnumerableCore(&local_538);
  linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
  ~IEnumerableCore(&local_568);
  std::vector<int,_std::allocator<int>_>::~vector(&local_580);
  std::allocator<int>::~allocator(&local_5a9);
  local_6b8[0] = 1;
  local_6b8[1] = 5;
  local_6b8[2] = 6;
  local_6b8[3] = 7;
  local_6b8[4] = 5;
  local_6a0 = local_6b8;
  local_698 = 5;
  std::allocator<int>::allocator(&local_6b9);
  __l_02._M_len = local_698;
  __l_02._M_array = local_6a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_690,__l_02,&local_6b9);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_678,(linq *)&local_690,source_01);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>&>
            (&local_648,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             &local_678,source);
  iVar2 = linq::
          IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Max(&local_648);
  assertEquals<int,int>(7,iVar2);
  linq::
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::~IEnumerableCore(&local_648);
  linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
  ~IEnumerableCore(&local_678);
  std::vector<int,_std::allocator<int>_>::~vector(&local_690);
  std::allocator<int>::~allocator(&local_6b9);
  local_7c8[0] = 1;
  local_7c8[1] = 5;
  local_7c8[2] = 6;
  local_7c8[3] = 7;
  local_7c8[4] = 5;
  local_7b0 = local_7c8;
  local_7a8 = 5;
  std::allocator<int>::allocator(&local_7c9);
  __l_01._M_len = local_7a8;
  __l_01._M_array = local_7b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_7a0,__l_01,&local_7c9);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_788,(linq *)&local_7a0,source_02);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>&>
            (&local_758,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             &local_788,source);
  sVar3 = linq::
          IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count(&local_758);
  assertEquals<int,unsigned_long>(3,sVar3);
  linq::
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::~IEnumerableCore(&local_758);
  linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
  ~IEnumerableCore(&local_788);
  std::vector<int,_std::allocator<int>_>::~vector(&local_7a0);
  std::allocator<int>::~allocator(&local_7c9);
  local_8d8[0] = 1;
  local_8d8[1] = 5;
  local_8d8[2] = 6;
  local_8d8[3] = 7;
  local_8d8[4] = 5;
  local_8c0 = local_8d8;
  local_8b8 = 5;
  std::allocator<int>::allocator(&local_8d9);
  __l_00._M_len = local_8b8;
  __l_00._M_array = local_8c0;
  std::vector<int,_std::allocator<int>_>::vector(&local_8b0,__l_00,&local_8d9);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_898,(linq *)&local_8b0,source_03);
  linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
  Intersect<linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>>
            (&local_868,
             (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)source,
             &local_898);
  sVar3 = linq::
          IEnumerableCore<linq::IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count(&local_868);
  assertEquals<int,unsigned_long>(3,sVar3);
  linq::
  IEnumerableCore<linq::IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::~IEnumerableCore(&local_868);
  linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
  ~IEnumerableCore(&local_898);
  std::vector<int,_std::allocator<int>_>::~vector(&local_8b0);
  std::allocator<int>::~allocator(&local_8d9);
  local_9e8[0] = 1;
  local_9e8[1] = 5;
  local_9e8[2] = 6;
  local_9e8[3] = 7;
  local_9e8[4] = 5;
  local_9d0 = local_9e8;
  local_9c8 = 5;
  std::allocator<int>::allocator(&local_9e9);
  __l._M_len = local_9c8;
  __l._M_array = local_9d0;
  std::vector<int,_std::allocator<int>_>::vector(&local_9c0,__l,&local_9e9);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_9a8,(linq *)&local_9c0,source_04);
  linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
  Except<linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>>
            (&local_978,
             (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)source,
             &local_9a8);
  sVar3 = linq::
          IEnumerableCore<linq::ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count(&local_978);
  assertEquals<int,unsigned_long>(5,sVar3);
  linq::
  IEnumerableCore<linq::ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::~IEnumerableCore(&local_978);
  linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
  ~IEnumerableCore(&local_9a8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_9c0);
  std::allocator<int>::~allocator(&local_9e9);
  linq::IEnumerable<int>::Range(&local_a88,5,9);
  linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
  Except<linq::IEnumerable<int>>
            (&local_a70,
             (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)source,
             &local_a88);
  sVar3 = linq::
          IEnumerableCore<linq::ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count(&local_a70);
  assertEquals<int,unsigned_long>(3,sVar3);
  linq::
  IEnumerableCore<linq::ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::~IEnumerableCore(&local_a70);
  linq::IEnumerable<int>::~IEnumerable(&local_a88);
  linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
  Intersect<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>&>
            (&local_b18,
             (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)source,
             source);
  sVar3 = linq::
          IEnumerableCore<linq::IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count(&local_b18);
  assertEquals<int,unsigned_long>(8,sVar3);
  linq::
  IEnumerableCore<linq::IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::~IEnumerableCore(&local_b18);
  linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
  Except<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>&>
            (&local_ba8,
             (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)source,
             source);
  sVar3 = linq::
          IEnumerableCore<linq::ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count(&local_ba8);
  assertEquals<int,unsigned_long>(0,sVar3);
  linq::
  IEnumerableCore<linq::ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::~IEnumerableCore(&local_ba8);
  bVar1 = linq::
          IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
          ::Any(source);
  assertEquals<bool,bool>(true,bVar1);
  bVar1 = linq::
          IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
          ::All(source);
  assertEquals<bool,bool>(true,bVar1);
  bVar1 = linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
          Any<test<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>>(linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>)::_lambda(int)_10_>
                    ((IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)
                     source,&local_ba9);
  assertEquals<bool,bool>(true,bVar1);
  bVar1 = linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
          All<test<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>>(linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>)::_lambda(int)_11_>
                    ((IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)
                     source,&local_baa);
  assertEquals<bool,bool>(false,bVar1);
  bVar1 = linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
          Any<test<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>>(linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>)::_lambda(int)_12_>
                    ((IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)
                     source,&local_bab);
  assertEquals<bool,bool>(false,bVar1);
  bVar1 = linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::$_0,int>>::
          All<test<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>>(linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>)::_lambda(int)_13_>
                    ((IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>> *)
                     source,&local_bac);
  assertEquals<bool,bool>(true,bVar1);
  local_bb4[1] = 6;
  bVar1 = linq::
          IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
          ::Contains<int>(source,local_bb4 + 1);
  assertEquals<bool,bool>(true,bVar1);
  local_bb4[0] = 0x10;
  bVar1 = linq::
          IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
          ::Contains<int>(source,local_bb4);
  assertEquals<bool,bool>(false,bVar1);
  return;
}

Assistant:

void test(S source)
{
	assertEquals(    3, source.Min());
	assertEquals(   10, source.Max());
	assertEquals(    8, source.Count());
	assertEquals(   52, source.Sum());
	assertEquals(    3, source.Take(3).Min());
	assertEquals(    5, source.Take(3).Max());
	assertEquals(    6, source.Skip(3).Min());
	assertEquals(   10, source.Skip(3).Max());
	assertEquals(    3, source.TakeWhile([](int x){ return x < 5; }).Min());
	assertEquals(    4, source.TakeWhile([](int x){ return x < 5; }).Max());
	assertEquals(    5, source.SkipWhile([](int x){ return x < 5; }).Min());
	assertEquals(    4, source.Where([](int x){ return x < 7; }).Count());
	assertEquals(    6, source.Where([](int x){ return x % 3 == 0; }).Skip(1).First());
	assertEquals(    2, source.GroupBy([](int x){ return x < 5; }).Count());
	assertEquals(    6, source.GroupBy([](int x){ return x < 5; }).First().Count());
	assertEquals(    2, source.GroupBy([](int x){ return x < 5; }).Last().Count());
	assertEquals(    5, source.Single([](int x){ return x == 5; }));
	assertEquals(    5, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Min());
	assertEquals(    7, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Max());
	assertEquals(    3, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Count());
	assertEquals(    3, source.Intersect(Adapt(std::vector<int>{1,5,6,7,5})).Count());
	assertEquals(    5, source.Except(Adapt(std::vector<int>{1,5,6,7,5})).Count());
	assertEquals(    3, source.Except(IEnumerable<int>::Range(5,9)).Count());
	assertEquals(    8, source.Intersect(source).Count());
	assertEquals(    0, source.Except(source).Count());
	assertEquals( true, source.Any());
	assertEquals( true, source.All());
	assertEquals( true, source.Any([](int x) { return x > 9; }));
	assertEquals(false, source.All([](int x) { return x > 9; }));
	assertEquals(false, source.Any([](int x) { return x > 10; }));
	assertEquals( true, source.All([](int x) { return x <= 10; }));
	assertEquals( true, source.Contains(6));
	assertEquals(false, source.Contains(16));
}